

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O3

void __thiscall foxxll::config::~config(config *this)

{
  pointer pdVar1;
  pointer pdVar2;
  Logger LStack_198;
  
  this->_vptr_config = (_func_int **)&PTR__config_00167598;
  pdVar2 = (this->disks_list).
           super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar1 = (this->disks_list).
           super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar2 != pdVar1) {
    do {
      if (pdVar2->delete_on_exit == true) {
        tlx::Logger::Logger(&LStack_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&LStack_198,"foxxll: Removing disk file: ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&LStack_198,(pdVar2->path)._M_dataplus._M_p,
                   (pdVar2->path)._M_string_length);
        tlx::Logger::~Logger(&LStack_198);
        unlink((pdVar2->path)._M_dataplus._M_p);
        pdVar1 = (this->disks_list).
                 super__Vector_base<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != pdVar1);
  }
  std::vector<foxxll::disk_config,_std::allocator<foxxll::disk_config>_>::~vector(&this->disks_list)
  ;
  return;
}

Assistant:

config::~config()
{
    for (disk_list_type::const_iterator it = disks_list.begin();
         it != disks_list.end(); it++)
    {
        if (it->delete_on_exit)
        {
            TLX_LOG1 << "foxxll: Removing disk file: " << it->path;
            unlink(it->path.c_str());
        }
    }
}